

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O0

void __thiscall
xray_re::xr_ogf_v3::partition_io::import
          (partition_io *this,xr_ini_file *ini,char *part_name,xr_ogf_v3 *ogf)

{
  char *pcVar1;
  size_t this_00;
  undefined8 uVar2;
  xr_bone *pxVar3;
  allocator<char> local_99;
  value_type local_98;
  allocator<char> local_61;
  string local_60;
  char *local_40;
  char *bone_name;
  size_t i;
  size_t num_bones;
  xr_ogf_v3 *ogf_local;
  char *part_name_local;
  xr_ini_file *ini_local;
  partition_io *this_local;
  
  num_bones = (size_t)ogf;
  ogf_local = (xr_ogf_v3 *)part_name;
  part_name_local = (char *)ini;
  ini_local = (xr_ini_file *)this;
  i = xr_ini_file::line_count(ini,part_name);
  if (i == 0) {
    msg("empty partition section %s",ogf_local);
    uVar2 = __cxa_allocate_exception(1);
    __cxa_throw(uVar2,&xr_error::typeinfo,0);
  }
  std::__cxx11::string::operator=((string *)&(this->super_xr_partition).m_name,(char *)ogf_local);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&(this->super_xr_partition).m_bones,i);
  bone_name = (char *)0x0;
  while( true ) {
    if (bone_name == (char *)i) {
      return;
    }
    xr_ini_file::r_line((xr_ini_file *)part_name_local,(char *)ogf_local,(size_t)bone_name,&local_40
                        ,(char **)0x0);
    this_00 = num_bones;
    pcVar1 = local_40;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,pcVar1,&local_61);
    pxVar3 = xr_object::find_bone((xr_object *)this_00,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    pcVar1 = local_40;
    if (pxVar3 == (xr_bone *)0x0) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,pcVar1,&local_99);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(this->super_xr_partition).m_bones,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    bone_name = bone_name + 1;
  }
  msg("unknown bone %s in partition %s",local_40,ogf_local);
  uVar2 = __cxa_allocate_exception(1);
  __cxa_throw(uVar2,&xr_error::typeinfo,0);
}

Assistant:

inline void xr_ogf_v3::partition_io::import(const xr_ini_file& ini, const char* part_name, xr_ogf_v3& ogf)
{
	size_t num_bones = ini.line_count(part_name);
	if (num_bones == 0) {
		msg("empty partition section %s", part_name);
		throw xr_error();
	}

	m_name = part_name;
	m_bones.reserve(num_bones);
	for (size_t i = 0; i != num_bones; ++i) {
		const char* bone_name;
		ini.r_line(part_name, i, &bone_name, 0);
		if (ogf.find_bone(bone_name) == 0) {
			msg("unknown bone %s in partition %s", bone_name, part_name);
			throw xr_error();
		}
		m_bones.push_back(bone_name);
	}
}